

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.cpp
# Opt level: O0

void __thiscall sf::Shape::updateTexCoords(Shape *this)

{
  size_t sVar1;
  Vertex *pVVar2;
  long in_RDI;
  float fVar3;
  float fVar4;
  float yratio;
  float xratio;
  size_t i;
  FloatRect convertedTextureRect;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  ulong local_20;
  Rect<float> local_18;
  
  Rect<float>::Rect<int>(&local_18,(Rect<int> *)(in_RDI + 0xc0));
  local_20 = 0;
  while( true ) {
    sVar1 = VertexArray::getVertexCount((VertexArray *)0x21c518);
    if (sVar1 <= local_20) break;
    if (*(float *)(in_RDI + 0x138) <= 0.0) {
      fVar3 = 0.0;
    }
    else {
      pVVar2 = VertexArray::operator[]
                         ((VertexArray *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      fVar3 = ((pVVar2->position).x - *(float *)(in_RDI + 0x130)) / *(float *)(in_RDI + 0x138);
    }
    in_stack_ffffffffffffffc4 = fVar3;
    if (*(float *)(in_RDI + 0x13c) <= 0.0) {
      fVar4 = 0.0;
    }
    else {
      pVVar2 = VertexArray::operator[]
                         ((VertexArray *)CONCAT44(fVar3,in_stack_ffffffffffffffc0),
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      fVar4 = ((pVVar2->position).y - *(float *)(in_RDI + 0x134)) / *(float *)(in_RDI + 0x13c);
    }
    in_stack_ffffffffffffffb8 = local_18.width * fVar3 + local_18.left;
    in_stack_ffffffffffffffc0 = fVar4;
    pVVar2 = VertexArray::operator[]
                       ((VertexArray *)CONCAT44(in_stack_ffffffffffffffc4,fVar4),
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    (pVVar2->texCoords).x = in_stack_ffffffffffffffb8;
    in_stack_ffffffffffffffbc = local_18.height * fVar4 + local_18.top;
    pVVar2 = VertexArray::operator[]
                       ((VertexArray *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                        ,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    (pVVar2->texCoords).y = in_stack_ffffffffffffffbc;
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void Shape::updateTexCoords()
{
    FloatRect convertedTextureRect = FloatRect(m_textureRect);

    for (std::size_t i = 0; i < m_vertices.getVertexCount(); ++i)
    {
        float xratio = m_insideBounds.width > 0 ? (m_vertices[i].position.x - m_insideBounds.left) / m_insideBounds.width : 0;
        float yratio = m_insideBounds.height > 0 ? (m_vertices[i].position.y - m_insideBounds.top) / m_insideBounds.height : 0;
        m_vertices[i].texCoords.x = convertedTextureRect.left + convertedTextureRect.width * xratio;
        m_vertices[i].texCoords.y = convertedTextureRect.top + convertedTextureRect.height * yratio;
    }
}